

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O3

bool __thiscall
duckdb::ChunkVectorInfo::Cleanup
          (ChunkVectorInfo *this,transaction_t lowest_transaction,
          unique_ptr<duckdb::ChunkInfo,_std::default_delete<duckdb::ChunkInfo>,_true> *result)

{
  long lVar1;
  
  if (this->any_deleted != false) {
    return false;
  }
  if (this->same_inserted_id == false) {
    lVar1 = 0;
    do {
      if (lowest_transaction < this->inserted[lVar1 + 1]) {
        return false;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x7ff);
  }
  else if (lowest_transaction < this->insert_id) {
    return false;
  }
  return true;
}

Assistant:

bool ChunkVectorInfo::Cleanup(transaction_t lowest_transaction, unique_ptr<ChunkInfo> &result) const {
	if (any_deleted) {
		// if any rows are deleted we can't clean-up
		return false;
	}
	// check if the insertion markers have to be used by all transactions going forward
	if (!same_inserted_id) {
		for (idx_t idx = 1; idx < STANDARD_VECTOR_SIZE; idx++) {
			if (inserted[idx] > lowest_transaction) {
				// transaction was inserted after the lowest transaction start
				// we still need to use an older version - cannot compress
				return false;
			}
		}
	} else if (insert_id > lowest_transaction) {
		// transaction was inserted after the lowest transaction start
		// we still need to use an older version - cannot compress
		return false;
	}
	return true;
}